

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

fdb_status fdb_iterator_seek_to_min(fdb_iterator *iterator)

{
  long *in_RDI;
  fdb_status ret;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  fdb_status fVar1;
  
  if ((in_RDI == (long *)0x0) || (*in_RDI == 0)) {
    fVar1 = FDB_RESULT_INVALID_HANDLE;
  }
  else if (in_RDI[1] == 0) {
    fVar1 = _fdb_iterator_seek_to_min_seq((fdb_iterator *)0x16868c);
  }
  else {
    fVar1 = _fdb_iterator_seek_to_min_key
                      ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                      );
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_seek_to_min(fdb_iterator *iterator) {
    if (!iterator || !iterator->handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_status ret;
    LATENCY_STAT_START();

    if (!iterator->hbtrie_iterator) {
        ret = _fdb_iterator_seek_to_min_seq(iterator);
    } else {
        ret = _fdb_iterator_seek_to_min_key(iterator);
    }
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_SEEK_MIN);
    return ret;
}